

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::
get_match_positions_component_prefix_dirpath
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns)

{
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_first;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_last;
  ReverseIterator query_rit;
  ReverseIterator item_rit;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  ReverseIterator local_40;
  ReverseIterator local_38;
  
  local_48._M_current = (this->item_basename_)._M_current;
  item_first._M_current =
       (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_50._M_current = (this->qit_basename_)._M_current;
  _Var1._M_current =
       (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  while (query_last._M_current = local_50._M_current, local_50._M_current != _Var1._M_current) {
    local_40.current._M_current =
         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
         _Var1._M_current;
    local_38.current._M_current =
         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
         item_first._M_current;
    consume_path_component_match_front
              (this,(ReverseIterator *)&local_48,&local_38,(ReverseIterator *)&local_50,&local_40);
    Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits>::
    get_match_positions_greedy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits> *)this,posns,item_first,
               local_48,local_50,query_last);
  }
  return;
}

Assistant:

void get_match_positions_component_prefix_dirpath(
      std::vector<std::size_t>& posns) const {
    auto item_rit = ReverseIterator(item_basename_);
    auto const item_rlast = item_.crend();
    auto const item_first = item_.cbegin();
    auto query_rit = ReverseIterator(qit_basename_);
    auto const query_rlast = query_.crend();
    auto query_pc_last = query_rit.base();

    while (query_rit != query_rlast) {
      consume_path_component_match_front(item_rit, item_rlast, query_rit,
                                         query_rlast);
      get_match_positions_greedy(posns, item_first, item_rit.base(),
                                 query_rit.base(), query_pc_last);
      query_pc_last = query_rit.base();
    }
  }